

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

uint16_t reduce_once(uint16_t x)

{
  ushort uVar1;
  ushort uVar2;
  undefined6 in_register_0000003a;
  
  if ((uint)CONCAT62(in_register_0000003a,x) < 0x1a02) {
    uVar2 = x - 0xd01;
    uVar1 = 0;
    if (0 < (short)uVar2) {
      uVar1 = uVar2;
    }
    return uVar1 | (short)uVar2 >> 0xf & x;
  }
  __assert_fail("constant_time_declassify_int(x < 2 * kPrime)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                ,0x8a,"uint16_t reduce_once(uint16_t)");
}

Assistant:

static uint16_t reduce_once(uint16_t x) {
  declassify_assert(x < 2 * kPrime);
  const uint16_t subtracted = x - kPrime;
  uint16_t mask = 0u - (subtracted >> 15);
  // Although this is a constant-time select, we omit a value barrier here.
  // Value barriers impede auto-vectorization (likely because it forces the
  // value to transit through a general-purpose register). On AArch64, this is a
  // difference of 2x.
  //
  // We usually add value barriers to selects because Clang turns consecutive
  // selects with the same condition into a branch instead of CMOV/CSEL. This
  // condition does not occur in Kyber, so omitting it seems to be safe so far,
  // but see |scalar_centered_binomial_distribution_eta_2_with_prf|.
  return (mask & x) | (~mask & subtracted);
}